

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces
          (ChElementTetraCorot_4_P *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  Index IVar12;
  Index index;
  ulong uVar13;
  ulong uVar14;
  Index index_1;
  ActualDstType actualDst;
  long lVar15;
  Index size;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  Scalar local_20;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 4) {
    __assert_fail("Fi.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                  ,0x1f1,
                  "virtual void chrono::fea::ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,4);
  (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[6])(this,&local_38);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_38.m_storage.m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_48,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar13 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_48.m_storage.m_rows != uVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,uVar13,1);
  }
  if (-1 < local_48.m_storage.m_rows) {
    if (local_48.m_storage.m_rows != 0) {
      memset(local_48.m_storage.m_data,0,local_48.m_storage.m_rows << 3);
    }
    local_20 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_48,&this->StiffnessMatrix,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_38,&local_20);
    IVar12 = local_48.m_storage.m_rows;
    pdVar11 = local_48.m_storage.m_data;
    if (-1 < local_48.m_storage.m_rows) {
      uVar13 = local_48.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < local_48.m_storage.m_rows) {
        uVar14 = 0;
        auVar16 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        do {
          auVar17 = vxorps_avx512dq(auVar16,*(undefined1 (*) [64])
                                             (local_48.m_storage.m_data + uVar14));
          *(undefined1 (*) [64])(local_48.m_storage.m_data + uVar14) = auVar17;
          uVar14 = uVar14 + 8;
        } while (uVar14 < uVar13);
      }
      if ((long)uVar13 < local_48.m_storage.m_rows) {
        do {
          auVar18._0_8_ = -local_48.m_storage.m_data[uVar13];
          auVar18._8_4_ = 0;
          auVar18._12_4_ = 0x80000000;
          dVar3 = (double)vmovlps_avx(auVar18);
          local_48.m_storage.m_data[uVar13] = dVar3;
          uVar13 = uVar13 + 1;
        } while (local_48.m_storage.m_rows != uVar13);
      }
      if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
          local_48.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   local_48.m_storage.m_rows,1);
      }
      uVar13 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      if (uVar13 != IVar12) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
      pdVar4 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar14 = uVar13 + 7;
      if (-1 < (long)uVar13) {
        uVar14 = uVar13;
      }
      uVar14 = uVar14 & 0xfffffffffffffff8;
      if (7 < (long)uVar13) {
        lVar15 = 0;
        do {
          pdVar1 = pdVar11 + lVar15;
          dVar3 = pdVar1[1];
          dVar5 = pdVar1[2];
          dVar6 = pdVar1[3];
          dVar7 = pdVar1[4];
          dVar8 = pdVar1[5];
          dVar9 = pdVar1[6];
          dVar10 = pdVar1[7];
          pdVar2 = pdVar4 + lVar15;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar3;
          pdVar2[2] = dVar5;
          pdVar2[3] = dVar6;
          pdVar2[4] = dVar7;
          pdVar2[5] = dVar8;
          pdVar2[6] = dVar9;
          pdVar2[7] = dVar10;
          lVar15 = lVar15 + 8;
        } while (lVar15 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar13) {
        do {
          pdVar4[uVar14] = pdVar11[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      if (local_48.m_storage.m_data != (double *)0x0) {
        free((void *)local_48.m_storage.m_data[-1]);
      }
      if (local_38.m_storage.m_data != (double *)0x0) {
        free((void *)local_38.m_storage.m_data[-1]);
      }
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChElementTetraCorot_4_P::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 4);

    // set up vector of nodal fields
    ChVectorDynamic<> displ(4);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * P
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    //***TO DO*** derivative terms? + [Rlocal] * P_dt ???? ***NO because Poisson  rho dP/dt + div [C] grad P = 0

    FiK_local *= -1.0;

    // ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);  ***corotation NOT NEEDED

    Fi = FiK_local;
}